

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O3

FStringProd * DoubleToString(FProduction *prod)

{
  FStringProd *pFVar1;
  char buf [128];
  char acStack_98 [136];
  
  mysnprintf(acStack_98,0x80,"%g",*(undefined8 *)(prod + 2));
  pFVar1 = NewStringProd(acStack_98);
  M_Free(prod);
  return pFVar1;
}

Assistant:

static FStringProd *DoubleToString (FProduction *prod)
{
	char buf[128];
	FStringProd *newprod;

	mysnprintf (buf, countof(buf), "%g", static_cast<FDoubleProd *>(prod)->Value);
	newprod = NewStringProd (buf);
	M_Free (prod);
	return newprod;
}